

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

Federate * __thiscall helics::Federate::operator=(Federate *this,Federate *fed)

{
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  LOCK();
  (this->currentMode)._M_i = (fed->currentMode)._M_i;
  UNLOCK();
  LOCK();
  (fed->currentMode)._M_i = FINALIZE;
  UNLOCK();
  (this->fedID).fid = (fed->fedID).fid;
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &(fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
  CoreFactory::getEmptyCore();
  std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(fed->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_28._M_refcount);
  (this->mCurrentTime).internalTimeCode = (fed->mCurrentTime).internalTimeCode;
  this->nameSegmentSeparator = fed->nameSegmentSeparator;
  this->strictConfigChecking = fed->strictConfigChecking;
  std::
  __uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator=((__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)&this->asyncCallInfo,
              (__uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               *)&fed->asyncCallInfo);
  this->observerMode = fed->observerMode;
  std::
  __uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator=((__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)&this->cManager,
              (__uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
               *)&fed->cManager);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fed->mName);
  return this;
}

Assistant:

Federate& Federate::operator=(Federate&& fed) noexcept
{
    auto tstate = fed.currentMode.load();
    currentMode.store(tstate);
    fed.currentMode.store(Modes::FINALIZE);
    fedID = fed.fedID;
    coreObject = std::move(fed.coreObject);
    fed.coreObject = CoreFactory::getEmptyCore();
    mCurrentTime = fed.mCurrentTime;
    nameSegmentSeparator = fed.nameSegmentSeparator;
    strictConfigChecking = fed.strictConfigChecking;
    asyncCallInfo = std::move(fed.asyncCallInfo);
    observerMode = fed.observerMode;
    cManager = std::move(fed.cManager);
    mName = std::move(fed.mName);
    return *this;
}